

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O0

void __thiscall board::Board::reset(Board *this)

{
  int *__first;
  int *__last;
  unsigned_long *__first_00;
  unsigned_long *__last_00;
  int local_48;
  int local_44;
  int j;
  int i_1;
  int local_34;
  int *piStack_30;
  int i;
  int *__end1;
  int *__begin1;
  int (*__range1) [64];
  Board *local_10;
  Board *this_local;
  
  local_10 = this;
  __first = std::begin<int,120ul>(this->board);
  __last = std::end<int,120ul>(this->board);
  __range1._4_4_ = 99;
  std::fill<int*,board::Square>(__first,__last,(Square *)((long)&__range1 + 4));
  __begin1 = SQ120;
  piStack_30 = CASTLE_PERM_MASK;
  for (__end1 = SQ120; __end1 != CASTLE_PERM_MASK; __end1 = __end1 + 1) {
    local_34 = *__end1;
    this->board[local_34] = 0;
  }
  __first_00 = std::begin<unsigned_long,3ul>((unsigned_long (*) [3])this->pawns);
  __last_00 = std::end<unsigned_long,3ul>((unsigned_long (*) [3])this->pawns);
  _j = 0;
  std::fill<unsigned_long*,unsigned_long_long>(__first_00,__last_00,(unsigned_long_long *)&j);
  for (local_44 = 0; local_44 < 0xd; local_44 = local_44 + 1) {
    this->pNum[local_44] = 0;
    for (local_48 = 0; local_48 < 10; local_48 = local_48 + 1) {
      this->pList[local_44][local_48] = 0;
    }
  }
  this->material[0] = 0;
  this->material[1] = 0;
  this->side = 2;
  this->ply = 0;
  this->fiftyMove = 0;
  this->enPas = 99;
  this->castlePerm = 0;
  this->hashKey = 0;
  std::vector<board::Undo,_std::allocator<board::Undo>_>::clear(&this->history);
  clearSearchKillers(this);
  clearSearchHistory(this);
  return;
}

Assistant:

void board::Board::reset()
{
    std::fill(std::begin(board), std::end(board), NO_SQ);
    for (int i : SQ120) {
        board[i] = EMPTY;
    }
    std::fill(std::begin(pawns), std::end(pawns), 0ULL);
    for (int i = 0; i < 13; i++) {
        pNum[i] = 0;
        for (int j = 0; j < 10; j++) {
            pList[i][j] = 0;
        }
    }
    material[WHITE] = 0;
    material[BLACK] = 0;
    side = BOTH;
    ply = 0;
    fiftyMove = 0;
    enPas = NO_SQ;
    castlePerm = 0;
    hashKey = 0ULL;
    history.clear();
    clearSearchKillers();
    clearSearchHistory();
}